

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O1

void __thiscall nesvis::PpuWidget::draw_palettes(PpuWidget *this)

{
  bool bVar1;
  uint uVar2;
  Color CVar3;
  IPpu *pIVar4;
  ImGuiStyle *pIVar5;
  long lVar6;
  uint16_t address;
  ulong uVar7;
  long *plVar8;
  int iVar9;
  ImVec4 color;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  palette_text;
  ImVec4 local_140;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  ImGui::Text("Background palette");
  ImGui::PushID("background palette");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"Background 0","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Background 1","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Background 2","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Background 3","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Sprite 0","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Sprite 1","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Sprite 2","");
  plVar8 = local_40;
  local_50[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Sprite 3","");
  uVar7 = 0x3f00;
  iVar9 = 0;
  do {
    pIVar4 = n_e_s::nes::Nes::ppu(this->nes_);
    uVar2 = (*pIVar4->_vptr_IPpu[2])(pIVar4,uVar7 & 0xffff);
    uVar2 = uVar2 & 0xff;
    ImGui::PushID(uVar2);
    if ((uVar7 & 3) == 0) {
      ImGui::Text("%s",local_130[(long)iVar9 * 4]);
      ImGui::SameLine(100.0,-1.0);
      iVar9 = iVar9 + 1;
    }
    if ((uVar7 & 3) != 0) {
      pIVar5 = ImGui::GetStyle();
      ImGui::SameLine(0.0,(pIVar5->ItemSpacing).y);
    }
    CVar3 = PpuHelper::get_color_from_index(this->ppu_helper_,(uint16_t)uVar2);
    local_140.x = (float)((uint)CVar3 & 0xff) / 255.0;
    local_140.y = (float)((uint)CVar3 >> 8 & 0xff) / 255.0;
    local_140.z = (float)((uint)CVar3 >> 0x10 & 0xff) / 255.0;
    local_140.w = (float)((uint)CVar3 >> 0x18) / 255.0;
    ImGui::ColorButton("##backgroundpalette",&local_140,0x44,(ImVec2)0x41a0000041a00000);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Address: %04hX",uVar7);
      ImGui::Text("index: %02hhX",(ulong)uVar2);
      ImGui::EndTooltip();
    }
    ImGui::PopID();
    uVar2 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar2;
  } while (uVar2 != 0x3f20);
  ImGui::PopID();
  ImGui::PushID("palette");
  uVar2 = 0;
  do {
    ImGui::PushID(uVar2);
    if ((uVar2 & 0xf) != 0) {
      pIVar5 = ImGui::GetStyle();
      ImGui::SameLine(0.0,(pIVar5->ItemSpacing).y);
    }
    CVar3 = PpuHelper::get_color_from_index(this->ppu_helper_,(uint16_t)uVar2);
    local_140.x = (float)((uint)CVar3 & 0xff) / 255.0;
    local_140.y = (float)((uint)CVar3 >> 8 & 0xff) / 255.0;
    local_140.z = (float)((uint)CVar3 >> 0x10 & 0xff) / 255.0;
    local_140.w = (float)((uint)CVar3 >> 0x18) / 255.0;
    ImGui::ColorButton("##palette",&local_140,4,(ImVec2)0x41a0000041a00000);
    ImGui::PopID();
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x40);
  ImGui::PopID();
  lVar6 = -0x100;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  return;
}

Assistant:

void PpuWidget::draw_palettes() {
    ImGui::Text("Background palette");
    ImGui::PushID("background palette");

    const std::array<std::string, 8> palette_text = {"Background 0",
            "Background 1",
            "Background 2",
            "Background 3",
            "Sprite 0",
            "Sprite 1",
            "Sprite 2",
            "Sprite 3"};
    int text_index = 0;

    for (uint16_t address = 0x3F00; address < 0x3F20; ++address) {
        const uint8_t palette_index = nes_->ppu().read_byte(address);
        ImGui::PushID(palette_index);
        if ((address % 4) == 0) {
            ImGui::Text("%s", palette_text[text_index++].c_str());
            ImGui::SameLine(100);
        }
        if ((address % 4) != 0) {
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemSpacing.y);
        }
        const ImVec4 color = ppu_helper_->get_color_from_index(palette_index);
        ImGui::ColorButton("##backgroundpalette",
                color,
                ImGuiColorEditFlags_NoPicker | ImGuiColorEditFlags_NoTooltip,
                ImVec2(20, 20));
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Address: %04hX", address);
            ImGui::Text("index: %02hhX", palette_index);
            ImGui::EndTooltip();
        }

        ImGui::PopID();
    }
    ImGui::PopID(); // background palette

    ImGui::PushID("palette");
    for (int n = 0; n < ppu_helper_->kPaletteSize; n++) {
        ImGui::PushID(n);
        if ((n % 16) != 0) {
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemSpacing.y);
        }
        const ImVec4 color = ppu_helper_->get_color_from_index(n);
        ImGui::ColorButton("##palette",
                color,
                ImGuiColorEditFlags_NoPicker,
                ImVec2(20, 20));

        ImGui::PopID();
    }
    ImGui::PopID(); // palette
}